

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

ClassType *
slang::ast::Lookup::findClass
          (NameSyntax *className,ASTContext *context,optional<slang::DiagCode> requireInterfaceClass
          )

{
  bool bVar1;
  ClassType *pCVar2;
  Diagnostic *pDVar3;
  DiagCode code;
  SourceRange SVar4;
  LookupResult result;
  
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)result.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .firstElement;
  result.found = (Symbol *)0x0;
  result.systemSubroutine._0_5_ = 0;
  result.systemSubroutine._5_3_ = 0;
  result.upwardCount = 0;
  result.flags.m_bits = '\0';
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  result.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                firstElement;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  name(className,context,(bitmask<slang::ast::LookupFlags>)0x81,&result);
  LookupResult::reportDiags(&result,context);
  if (result.found != (Symbol *)0x0) {
    if (((uint6)requireInterfaceClass.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                super__Optional_payload_base<slang::DiagCode> & 0x100000000) == 0) {
LAB_0072aa54:
      bVar1 = Symbol::isType(result.found);
      if (bVar1) {
        bVar1 = Type::isClass((Type *)result.found);
        if (bVar1) {
          pCVar2 = (ClassType *)Type::getCanonicalType((Type *)result.found);
          if ((((uint6)requireInterfaceClass.super__Optional_base<slang::DiagCode,_true,_true>.
                       _M_payload.super__Optional_payload_base<slang::DiagCode> & 0x100000000) == 0)
             || (pCVar2->isInterface != false)) goto LAB_0072ab4b;
          SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)className);
          pDVar3 = ASTContext::addDiag(context,requireInterfaceClass.
                                               super__Optional_base<slang::DiagCode,_true,_true>.
                                               _M_payload.
                                               super__Optional_payload_base<slang::DiagCode>.
                                               _M_payload._M_value,SVar4);
          Diagnostic::operator<<(pDVar3,(pCVar2->super_Type).super_Symbol.name);
          goto LAB_0072ab48;
        }
      }
      bVar1 = Symbol::isType(result.found);
      if (bVar1) {
        bVar1 = Type::isError((Type *)result.found);
        if (bVar1) goto LAB_0072ab48;
      }
      SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)className);
      pDVar3 = ASTContext::addDiag(context,(DiagCode)0x1e000a,SVar4);
      Diagnostic::operator<<(pDVar3,(result.found)->name);
    }
    else {
      if ((result.flags.m_bits & 8) == 0) {
        if ((result.flags.m_bits & 0x10) == 0) goto LAB_0072aa54;
        SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)className);
        code.subsystem = Lookup;
        code.code = 0xc;
      }
      else {
        SVar4 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)className);
        code.subsystem = Lookup;
        code.code = 0xd;
      }
      ASTContext::addDiag(context,code,SVar4);
    }
  }
LAB_0072ab48:
  pCVar2 = (ClassType *)0x0;
LAB_0072ab4b:
  LookupResult::~LookupResult(&result);
  return pCVar2;
}

Assistant:

const ClassType* Lookup::findClass(const NameSyntax& className, const ASTContext& context,
                                   std::optional<DiagCode> requireInterfaceClass) {
    LookupResult result;
    Lookup::name(className, context, LookupFlags::Type | LookupFlags::NoSelectors, result);
    result.reportDiags(context);
    if (!result.found)
        return nullptr;

    if (requireInterfaceClass) {
        if (result.flags.has(LookupResultFlags::FromTypeParam)) {
            context.addDiag(diag::IfaceExtendTypeParam, className.sourceRange());
            return nullptr;
        }

        if (result.flags.has(LookupResultFlags::FromForwardTypedef)) {
            context.addDiag(diag::IfaceExtendIncomplete, className.sourceRange());
            return nullptr;
        }
    }

    if (!result.found->isType() || !result.found->as<Type>().isClass()) {
        if (!result.found->isType() || !result.found->as<Type>().isError())
            context.addDiag(diag::NotAClass, className.sourceRange()) << result.found->name;
        return nullptr;
    }

    auto& classType = result.found->as<Type>().getCanonicalType().as<ClassType>();

    if (requireInterfaceClass && !classType.isInterface) {
        context.addDiag(*requireInterfaceClass, className.sourceRange()) << classType.name;
        return nullptr;
    }

    return &classType;
}